

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall
kratos::PackedSlice::PackedSlice(PackedSlice *this,VarPackedStruct *parent,string *member_name)

{
  PackedStruct *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  VarSlice::VarSlice(&this->super_VarSlice,&parent->super_Var,0,0);
  (this->super_VarSlice).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002cc2f0;
  this->def_ = (PackedStructFieldDef *)0x0;
  this->original_struct_ = (PackedStruct *)0x0;
  (*(parent->super_Var).super_IRNode._vptr_IRNode[0x2d])(&local_30,parent);
  set_up(this,local_30,member_name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return;
}

Assistant:

PackedSlice::PackedSlice(kratos::VarPackedStruct *parent, const std::string &member_name)
    : VarSlice(parent, 0, 0) {
    auto const &struct_ = parent->packed_struct();
    set_up(*struct_, member_name);
}